

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O0

long vorbis_book_decodev_set(codebook *book,float *a,oggpack_buffer *b,int n)

{
  float *pfVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  int local_44;
  int i_1;
  float *t;
  int entry;
  int j;
  int i;
  int n_local;
  oggpack_buffer *b_local;
  float *a_local;
  codebook *book_local;
  
  if (book->used_entries < 1) {
    local_44 = 0;
    while (local_44 < n) {
      a[local_44] = 0.0;
      local_44 = local_44 + 1;
    }
  }
  else {
    entry = 0;
    while (entry < n) {
      lVar4 = decode_packed_entry_number(book,b);
      if ((int)lVar4 == -1) {
        return -1;
      }
      pfVar1 = book->valuelist;
      lVar2 = book->dim;
      t._4_4_ = 0;
      while( true ) {
        bVar3 = false;
        if (entry < n) {
          bVar3 = (long)t._4_4_ < book->dim;
        }
        if (!bVar3) break;
        a[entry] = pfVar1[(int)lVar4 * lVar2 + (long)t._4_4_];
        t._4_4_ = t._4_4_ + 1;
        entry = entry + 1;
      }
    }
  }
  return 0;
}

Assistant:

long vorbis_book_decodev_set(codebook *book,float *a,oggpack_buffer *b,int n){
  if(book->used_entries>0){
    int i,j,entry;
    float *t;

    for(i=0;i<n;){
      entry = decode_packed_entry_number(book,b);
      if(entry==-1)return(-1);
      t     = book->valuelist+entry*book->dim;
      for (j=0;i<n && j<book->dim;){
        a[i++]=t[j++];
      }
    }
  }else{
    int i;

    for(i=0;i<n;){
      a[i++]=0.f;
    }
  }
  return(0);
}